

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

predict_type
recall_tree_ns::predict_from(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t b_00;
  node *pnVar3;
  uint in_ECX;
  learner<char,_example> *in_RDX;
  example *in_RSI;
  recall_tree *in_RDI;
  bool cond;
  uint32_t newcn;
  uint32_t save_pred;
  label_t mc;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t a;
  undefined4 local_2c;
  undefined4 uVar4;
  learner<char,_example> *plVar5;
  example *base_00;
  predict_type local_8;
  
  local_2c = (undefined4)*(undefined8 *)(in_RDX + 0x6828);
  uVar4 = (undefined4)((ulong)*(undefined8 *)(in_RDX + 0x6828) >> 0x20);
  uVar1 = *(undefined4 *)(in_RDX + 0x6850);
  *(undefined8 *)(in_RDX + 0x6828) = 0x7f7fffff;
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  do {
    a = in_ECX;
    pnVar3 = v_array<recall_tree_ns::node>::operator[](&in_RDI->nodes,(ulong)a);
    plVar5 = in_RDX;
    base_00 = in_RSI;
    if ((pnVar3->internal & 1U) == 0) break;
    v_array<recall_tree_ns::node>::operator[](&in_RDI->nodes,(ulong)a);
    LEARNER::learner<char,_example>::predict
              (in_RDX,in_RSI,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    pnVar3 = v_array<recall_tree_ns::node>::operator[](&in_RDI->nodes,(ulong)a);
    in_ECX = descend(pnVar3,*(float *)(plVar5 + 0x68a8));
    bVar2 = stop_recurse_check((recall_tree *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    in_RDX = plVar5;
    in_RSI = base_00;
  } while (!bVar2);
  *(ulong *)(plVar5 + 0x6828) = CONCAT44(uVar4,local_2c);
  *(undefined4 *)(plVar5 + 0x6850) = uVar1;
  b_00 = oas_predict(in_RDI,(single_learner *)base_00,(uint32_t)((ulong)plVar5 >> 0x20),
                     (example *)CONCAT44(a,uVar4));
  predict_type::predict_type(&local_8,a,b_00);
  return local_8;
}

Assistant:

predict_type predict_from(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_router);
    uint32_t newcn = descend(b.nodes[cn], ec.partial_prediction);
    bool cond = stop_recurse_check(b, cn, newcn);

    if (cond)
      break;

    cn = newcn;
  }

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return predict_type(cn, oas_predict(b, base, cn, ec));
}